

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void __thiscall
ptc::Print<char>::
print_backend<std::__cxx11::ostringstream&,std::__cxx11::list<int,std::allocator<int>>&>
          (Print<char> *this,
          basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *os,
          list<int,_std::allocator<int>_> *first)

{
  ostream *os_00;
  
  std::mutex::lock((mutex *)mutex_);
  if ((this->pattern)._M_string_length == 0) {
    anon_unknown_8::operator<<<std::__cxx11::list,_int,_std::allocator<int>,_char>
              ((basic_ostream<char,_std::char_traits<char>_> *)os,first);
  }
  else {
    os_00 = std::operator<<((ostream *)os,(string *)&this->pattern);
    anon_unknown_8::operator<<<std::__cxx11::list,_int,_std::allocator<int>,_char>(os_00,first);
    std::operator<<(os_00,(string *)&this->pattern);
  }
  std::operator<<((ostream *)os,(string *)this);
  if (this->flush == true) {
    std::ostream::flush();
  }
  pthread_mutex_unlock((pthread_mutex_t *)mutex_);
  return;
}

Assistant:

void print_backend( T_os&& os, T&& first, Args&&... args ) const
     {
      std::lock_guard <std::mutex> lock{ mutex_ };

      // Printing the first argument
      if( is_escape( first, ANSI::first ) || pattern.empty() ) os << first;
      else os << pattern << first << pattern;
      
      // Printing all the other arguments
      if constexpr( sizeof...( args ) > 0 ) 
       {
        if ( is_escape( first, ANSI::first ) ) 
         {
          if( pattern.empty() ) ( ( os << args << sep ), ...);
          else ( ( os << pattern << args << pattern << sep ), ...);
         }
        else 
         {
          if( pattern.empty() ) ( ( os << sep << args ), ...);
          else ( ( os << sep << pattern << args << pattern ), ...);
         }
       }
      os << end;
      
      // Resetting the stream from ANSI escape sequences
      if constexpr( sizeof...( args ) > 0 )
       {
        if ( is_escape( first, ANSI::generic ) || ( ( is_escape( args, ANSI::generic ) ) || ...) )
         {
          os << "\033[0m";
         }
       }
      else 
       {
       if ( is_escape( first, ANSI::generic ) ) 
        {
         os << "\033[0m";
        }
       }

      // Other operations
      if ( flush ) os << std::flush;
     }